

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultConfigRuleSyntax,slang::syntax::DefaultConfigRuleSyntax_const&>
          (BumpAllocator *this,DefaultConfigRuleSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ConfigLiblistSyntax *pCVar4;
  Info *pIVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  DefaultConfigRuleSyntax *pDVar15;
  
  pDVar15 = (DefaultConfigRuleSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_ConfigRuleSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConfigRuleSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConfigRuleSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->defaultKeyword).kind;
  uVar8 = (args->defaultKeyword).field_0x2;
  NVar9.raw = (args->defaultKeyword).numFlags.raw;
  uVar10 = (args->defaultKeyword).rawLen;
  pIVar3 = (args->defaultKeyword).info;
  pCVar4 = (args->liblist).ptr;
  TVar11 = (args->semi).kind;
  uVar12 = (args->semi).field_0x2;
  NVar13.raw = (args->semi).numFlags.raw;
  uVar14 = (args->semi).rawLen;
  pIVar5 = (args->semi).info;
  (pDVar15->super_ConfigRuleSyntax).super_SyntaxNode.kind =
       (args->super_ConfigRuleSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar15->super_ConfigRuleSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pDVar15->super_ConfigRuleSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar15->super_ConfigRuleSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar15->defaultKeyword).kind = TVar7;
  (pDVar15->defaultKeyword).field_0x2 = uVar8;
  (pDVar15->defaultKeyword).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar15->defaultKeyword).rawLen = uVar10;
  (pDVar15->defaultKeyword).info = pIVar3;
  (pDVar15->liblist).ptr = pCVar4;
  (pDVar15->semi).kind = TVar11;
  (pDVar15->semi).field_0x2 = uVar12;
  (pDVar15->semi).numFlags = (NumericTokenFlags)NVar13.raw;
  (pDVar15->semi).rawLen = uVar14;
  (pDVar15->semi).info = pIVar5;
  return pDVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }